

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O2

void __thiscall OpenMD::COHZ::writeCorrelate(COHZ *this)

{
  string *__lhs;
  double *pdVar1;
  long lVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  uint j;
  ulong uVar7;
  Revision r;
  string local_6b0;
  string HHfile;
  string OHfile;
  string Dfile;
  ofstream ofs3;
  ofstream ofs2;
  ofstream ofs1;
  
  __lhs = &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
           super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
           super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.outputFilename_;
  std::operator+(&Dfile,__lhs,"D");
  std::operator+(&OHfile,__lhs,"OH");
  std::operator+(&HHfile,__lhs,"HH");
  std::ofstream::ofstream(&ofs1,Dfile._M_dataplus._M_p,_S_out);
  std::ofstream::ofstream(&ofs2,OHfile._M_dataplus._M_p,_S_out);
  std::ofstream::ofstream(&ofs3,HHfile._M_dataplus._M_p,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",
             Dfile._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar4 = std::operator<<((ostream *)&ofs1,"# ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                     super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_);
    std::operator<<(poVar4," for dipole vectors in water\n");
    poVar4 = std::operator<<((ostream *)&ofs1,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_6b0,&r);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_6b0);
    poVar4 = std::operator<<((ostream *)&ofs1,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_6b0,&r);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_6b0);
    poVar4 = std::operator<<((ostream *)&ofs1,"# selection script1: \"");
    std::operator<<(poVar4,(string *)
                           &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                            super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                            super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_);
    poVar4 = std::operator<<((ostream *)&ofs1,"\"\tselection script2: \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                     super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     selectionScript2_);
    std::operator<<(poVar4,"\"\n");
    poVar4 = std::operator<<((ostream *)&ofs1,"# privilegedAxis computed as ");
    poVar4 = std::operator<<(poVar4,(string *)&this->axisLabel_);
    std::operator<<(poVar4," axis \n");
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&ofs1,"# parameters: ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                       super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                       super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_)
      ;
      std::operator<<(poVar4,"\n");
    }
    std::operator<<((ostream *)&ofs1,"#time\tPn(costheta_z)\n");
    for (uVar6 = 0;
        uVar6 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_; uVar6 = uVar6 + 1) {
      pdVar1 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.times_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      std::ostream::_M_insert<double>(pdVar1[uVar6] - *pdVar1);
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < this->nZBins_; uVar7 = uVar7 + 1) {
        std::operator<<((ostream *)&ofs1,"\t");
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(this->histogram_).
                               super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar6].
                               super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                               ._M_impl.super__Vector_impl_data + lVar5));
        lVar5 = lVar5 + 0x20;
      }
      std::operator<<((ostream *)&ofs1,"\n");
    }
  }
  std::ofstream::close();
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",
             OHfile._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar4 = std::operator<<((ostream *)&ofs2,"# ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                     super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_);
    std::operator<<(poVar4," for OH bond vectors in water\n");
    poVar4 = std::operator<<((ostream *)&ofs2,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_6b0,&r);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_6b0);
    poVar4 = std::operator<<((ostream *)&ofs2,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_6b0,&r);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_6b0);
    poVar4 = std::operator<<((ostream *)&ofs2,"# selection script1: \"");
    std::operator<<(poVar4,(string *)
                           &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                            super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                            super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_);
    poVar4 = std::operator<<((ostream *)&ofs2,"\"\tselection script2: \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                     super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     selectionScript2_);
    std::operator<<(poVar4,"\"\n");
    poVar4 = std::operator<<((ostream *)&ofs2,"# privilegedAxis computed as ");
    poVar4 = std::operator<<(poVar4,(string *)&this->axisLabel_);
    std::operator<<(poVar4," axis \n");
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&ofs2,"# parameters: ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                       super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                       super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_)
      ;
      std::operator<<(poVar4,"\n");
    }
    std::operator<<((ostream *)&ofs2,"#time\tPn(costheta_z)\n");
    for (uVar6 = 0;
        uVar6 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_; uVar6 = uVar6 + 1) {
      pdVar1 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.times_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      std::ostream::_M_insert<double>(pdVar1[uVar6] - *pdVar1);
      lVar5 = 0x10;
      for (uVar7 = 0; uVar7 < this->nZBins_; uVar7 = uVar7 + 1) {
        std::operator<<((ostream *)&ofs2,"\t");
        lVar2 = *(long *)&(this->histogram_).
                          super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6].
                          super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                          ._M_impl.super__Vector_impl_data;
        std::ostream::_M_insert<double>
                  ((*(double *)(lVar2 + -8 + lVar5) + *(double *)(lVar2 + lVar5)) * 0.5);
        lVar5 = lVar5 + 0x20;
      }
      std::operator<<((ostream *)&ofs2,"\n");
    }
  }
  std::ofstream::close();
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",
             HHfile._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar4 = std::operator<<((ostream *)&ofs3,"# ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                     super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_);
    std::operator<<(poVar4," for HH bond vectors in water\n");
    poVar4 = std::operator<<((ostream *)&ofs3,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_6b0,&r);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_6b0);
    poVar4 = std::operator<<((ostream *)&ofs3,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_6b0,&r);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_6b0);
    poVar4 = std::operator<<((ostream *)&ofs3,"# selection script1: \"");
    std::operator<<(poVar4,(string *)
                           &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                            super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                            super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_);
    poVar4 = std::operator<<((ostream *)&ofs3,"\"\tselection script2: \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                     super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.
                                     selectionScript2_);
    std::operator<<(poVar4,"\"\n");
    poVar4 = std::operator<<((ostream *)&ofs3,"# privilegedAxis computed as ");
    poVar4 = std::operator<<(poVar4,(string *)&this->axisLabel_);
    std::operator<<(poVar4," axis \n");
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&ofs3,"# parameters: ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                                       super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                                       super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_)
      ;
      std::operator<<(poVar4,"\n");
    }
    std::operator<<((ostream *)&ofs3,"#time\tPn(costheta_z)\n");
    for (uVar6 = 0;
        uVar6 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_; uVar6 = uVar6 + 1) {
      pdVar1 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.times_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      std::ostream::_M_insert<double>(pdVar1[uVar6] - *pdVar1);
      lVar5 = 0x18;
      for (uVar7 = 0; uVar7 < this->nZBins_; uVar7 = uVar7 + 1) {
        std::operator<<((ostream *)&ofs3,"\t");
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(this->histogram_).
                               super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar6].
                               super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                               ._M_impl.super__Vector_impl_data + lVar5));
        lVar5 = lVar5 + 0x20;
      }
      std::operator<<((ostream *)&ofs3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs3);
  std::ofstream::~ofstream(&ofs2);
  std::ofstream::~ofstream(&ofs1);
  std::__cxx11::string::~string((string *)&HHfile);
  std::__cxx11::string::~string((string *)&OHfile);
  std::__cxx11::string::~string((string *)&Dfile);
  return;
}

Assistant:

void COHZ::writeCorrelate() {
    std::string Dfile  = getOutputFileName() + "D";
    std::string OHfile = getOutputFileName() + "OH";
    std::string HHfile = getOutputFileName() + "HH";

    std::ofstream ofs1(Dfile.c_str());
    std::ofstream ofs2(OHfile.c_str());
    std::ofstream ofs3(HHfile.c_str());

    if (ofs1.is_open()) {
      Revision r;

      ofs1 << "# " << getCorrFuncType() << " for dipole vectors in water\n";
      ofs1 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs1 << "# " << r.getBuildDate() << "\n";
      ofs1 << "# selection script1: \"" << selectionScript1_;
      ofs1 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs1 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs1 << "# parameters: " << paramString_ << "\n";

      ofs1 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs1 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs1 << "\t" << histogram_[i][j][0];
        }
        ofs1 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               Dfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs1.close();

    if (ofs2.is_open()) {
      Revision r;

      ofs2 << "# " << getCorrFuncType() << " for OH bond vectors in water\n";
      ofs2 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs2 << "# " << r.getBuildDate() << "\n";
      ofs2 << "# selection script1: \"" << selectionScript1_;
      ofs2 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs2 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs2 << "# parameters: " << paramString_ << "\n";

      ofs2 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs2 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs2 << "\t" << 0.5 * (histogram_[i][j][1] + histogram_[i][j][2]);
        }
        ofs2 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               OHfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs2.close();

    if (ofs3.is_open()) {
      Revision r;

      ofs3 << "# " << getCorrFuncType() << " for HH bond vectors in water\n";
      ofs3 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs3 << "# " << r.getBuildDate() << "\n";
      ofs3 << "# selection script1: \"" << selectionScript1_;
      ofs3 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs3 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs3 << "# parameters: " << paramString_ << "\n";

      ofs3 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs3 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs3 << "\t" << histogram_[i][j][3];
        }
        ofs3 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               HHfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs3.close();
  }